

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void google::protobuf::SetField
               (uint64 val,FieldDescriptor *field,Message *msg,Reflection *reflection)

{
  bool bVar1;
  Type TVar2;
  LogMessage *pLVar3;
  Reflection *this;
  uint64 in_RDI;
  int value_13;
  uint64 bit_rep_1;
  double value_12;
  uint32 bit_rep;
  float value_11;
  int64 value_10;
  int32 value_9;
  uint64 value_8;
  uint32 value_7;
  bool value_6;
  int64 value_5;
  int32 value_4;
  uint64 value_3;
  uint32 value_2;
  int64 value_1;
  int32 value;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  LogMessage *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  FieldDescriptor *in_stack_ffffffffffffff10;
  Message *in_stack_ffffffffffffff18;
  Message *in_stack_ffffffffffffff28;
  Reflection *in_stack_ffffffffffffff30;
  LogMessage local_c8;
  uint32 local_8c;
  uint32 local_78;
  int in_stack_ffffffffffffff8c;
  LogMessage *in_stack_ffffffffffffff90;
  
  TVar2 = FieldDescriptor::type(in_stack_ffffffffffffff10);
  this = (Reflection *)(ulong)(TVar2 - TYPE_DOUBLE);
  local_8c = (uint32)in_RDI;
  switch(this) {
  case (Reflection *)0x0:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x425639);
    if (bVar1) {
      Reflection::AddDouble
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (double)in_stack_ffffffffffffff18);
    }
    else {
      Reflection::SetDouble
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 (double)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    break;
  case (Reflection *)0x1:
    local_78 = local_8c;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4255b1);
    if (bVar1) {
      Reflection::AddFloat
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (float)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    else {
      Reflection::SetFloat
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
      ;
    }
    break;
  case (Reflection *)0x2:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4250fb);
    if (bVar1) {
      Reflection::AddInt64
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (int64)in_stack_ffffffffffffff18);
    }
    else {
      Reflection::SetInt64
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    break;
  case (Reflection *)0x3:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4251e4);
    if (bVar1) {
      Reflection::AddUInt64
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (uint64)in_stack_ffffffffffffff18);
    }
    else {
      Reflection::SetUInt64
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    break;
  case (Reflection *)0x4:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x425087);
    if (bVar1) {
      Reflection::AddInt32
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (int32)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    else {
      Reflection::SetInt32
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 (int32)in_stack_ffffffffffffff0c);
    }
    break;
  case (Reflection *)0x5:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x425445);
    if (bVar1) {
      Reflection::AddUInt64
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (uint64)in_stack_ffffffffffffff18);
    }
    else {
      Reflection::SetUInt64
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    break;
  case (Reflection *)0x6:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4253d1);
    if (bVar1) {
      Reflection::AddUInt32
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (uint32)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    else {
      Reflection::SetUInt32
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 (uint32)in_stack_ffffffffffffff0c);
    }
    break;
  case (Reflection *)0x7:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x425354);
    if (bVar1) {
      Reflection::AddBool(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                          (FieldDescriptor *)this,SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0))
      ;
    }
    else {
      Reflection::SetBool(this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          SUB41((uint)in_stack_ffffffffffffff0c >> 0x18,0));
    }
    break;
  default:
    pLVar3 = &local_c8;
    internal::LogMessage::LogMessage
              (pLVar3,(LogLevel_conflict)in_stack_ffffffffffffff0c,(char *)in_stack_ffffffffffffff00
               ,in_stack_fffffffffffffefc);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff00,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    FieldDescriptor::type((FieldDescriptor *)pLVar3);
    pLVar3 = internal::LogMessage::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    internal::LogFinisher::operator=
              ((LogFinisher *)pLVar3,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    internal::LogMessage::~LogMessage((LogMessage *)0x425774);
    break;
  case (Reflection *)0xc:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x425170);
    if (bVar1) {
      Reflection::AddUInt32
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (uint32)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    else {
      Reflection::SetUInt32
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 (uint32)in_stack_ffffffffffffff0c);
    }
    break;
  case (Reflection *)0xd:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4256ad);
    if (bVar1) {
      Reflection::AddEnumValue
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 (int)in_stack_ffffffffffffff0c);
    }
    else {
      Reflection::SetEnumValue
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 (int)in_stack_ffffffffffffff0c);
    }
    break;
  case (Reflection *)0xe:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4254ba);
    if (bVar1) {
      Reflection::AddInt32
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (int32)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    else {
      Reflection::SetInt32
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 (int32)in_stack_ffffffffffffff0c);
    }
    break;
  case (Reflection *)0xf:
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x42552e);
    if (bVar1) {
      Reflection::AddInt64
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (int64)in_stack_ffffffffffffff18);
    }
    else {
      Reflection::SetInt64
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    break;
  case (Reflection *)0x10:
    internal::WireFormatLite::ZigZagDecode32(local_8c);
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x425260);
    if (bVar1) {
      Reflection::AddInt32
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (int32)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    else {
      Reflection::SetInt32
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 (int32)in_stack_ffffffffffffff0c);
    }
    break;
  case (Reflection *)0x11:
    internal::WireFormatLite::ZigZagDecode64(in_RDI);
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4252d9);
    if (bVar1) {
      Reflection::AddInt64
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(FieldDescriptor *)this,
                 (int64)in_stack_ffffffffffffff18);
    }
    else {
      Reflection::SetInt64
                (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
  }
  return;
}

Assistant:

void SetField(uint64 val, const FieldDescriptor* field, Message* msg,
              const Reflection* reflection) {
#define STORE_TYPE(CPPTYPE_METHOD)                        \
  do                                                      \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
  while (0)

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD) \
  case FieldDescriptor::TYPE_##TYPE: {             \
    CPPTYPE value = val;                           \
    STORE_TYPE(CPPTYPE_METHOD);                    \
    break;                                         \
  }

    // Varints
    HANDLE_TYPE(INT32, int32, Int32)
    HANDLE_TYPE(INT64, int64, Int64)
    HANDLE_TYPE(UINT32, uint32, UInt32)
    HANDLE_TYPE(UINT64, uint64, UInt64)
    case FieldDescriptor::TYPE_SINT32: {
      int32 value = WireFormatLite::ZigZagDecode32(val);
      STORE_TYPE(Int32);
      break;
    }
    case FieldDescriptor::TYPE_SINT64: {
      int64 value = WireFormatLite::ZigZagDecode64(val);
      STORE_TYPE(Int64);
      break;
    }
      HANDLE_TYPE(BOOL, bool, Bool)

      // Fixed
      HANDLE_TYPE(FIXED32, uint32, UInt32)
      HANDLE_TYPE(FIXED64, uint64, UInt64)
      HANDLE_TYPE(SFIXED32, int32, Int32)
      HANDLE_TYPE(SFIXED64, int64, Int64)

    case FieldDescriptor::TYPE_FLOAT: {
      float value;
      uint32 bit_rep = val;
      std::memcpy(&value, &bit_rep, sizeof(value));
      STORE_TYPE(Float);
      break;
    }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value;
      uint64 bit_rep = val;
      std::memcpy(&value, &bit_rep, sizeof(value));
      STORE_TYPE(Double);
      break;
    }
    case FieldDescriptor::TYPE_ENUM: {
      int value = val;
      if (field->is_repeated()) {
        reflection->AddEnumValue(msg, field, value);
      } else {
        reflection->SetEnumValue(msg, field, value);
      }
      break;
    }
    default:
      GOOGLE_LOG(FATAL) << "Error in descriptors, primitve field with field type "
                 << field->type();
  }
#undef STORE_TYPE
#undef HANDLE_TYPE
}